

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t_conflict *context)

{
  player *ppVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t dam;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  source origin_04;
  source origin_05;
  int local_14;
  wchar_t nasty_tricks_count;
  effect_handler_context_t_conflict *context_local;
  
  uVar3 = Rand_div(3);
  for (local_14 = uVar3 + 4; 0 < local_14; local_14 = local_14 + -1) {
    if (context->obj->pval * 2 < (player->state).skills[3]) {
      uVar3 = Rand_div(6);
      ppVar1 = player;
      if (uVar3 == 0) {
        dam = damroll(5,0x14);
        take_hit(ppVar1,dam,"a chest dispel-player trap");
      }
      else {
        uVar3 = Rand_div(5);
        if (uVar3 == 0) {
          player_inc_timed(player,L'\b',L'È',true,true,true);
        }
        else {
          uVar3 = Rand_div(4);
          if (uVar3 == 0) {
            _Var2 = player_of_has(player,L'\x0f');
            ppVar1 = player;
            if (_Var2) {
              uVar3 = Rand_div(100);
              player_inc_timed(ppVar1,L'\t',uVar3 + L'\n',true,true,true);
            }
            else {
              uVar3 = Rand_div(6);
              player_inc_timed(ppVar1,L'\x03',uVar3 + L'\x02',true,true,true);
            }
          }
          else {
            uVar3 = Rand_div(3);
            if (uVar3 == 0) {
              origin._4_4_ = 0;
              origin.what = (context->origin).what;
              origin.which.trap = (context->origin).which.trap;
              effect_simple(L'0',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
            }
            else {
              uVar3 = Rand_div(2);
              if (uVar3 == 0) {
                origin_00._4_4_ = 0;
                origin_00.what = (context->origin).what;
                origin_00.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_00,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_01._4_4_ = 0;
                origin_01.what = (context->origin).what;
                origin_01.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_01,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_02._4_4_ = 0;
                origin_02.what = (context->origin).what;
                origin_02.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_02,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_03._4_4_ = 0;
                origin_03.what = (context->origin).what;
                origin_03.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_03,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_04._4_4_ = 0;
                origin_04.what = (context->origin).what;
                origin_04.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_04,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
              }
              else {
                origin_05._4_4_ = 0;
                origin_05.what = (context->origin).what;
                origin_05.which.trap = (context->origin).which.trap;
                effect_simple(L'M',origin_05,"150",L'\n',L'\x01',L'\0',L'\0',L'\0',(_Bool *)0x0);
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t *context)
{
	/* Determine how many nasty tricks can be played. */
	int nasty_tricks_count = 4 + randint0(3);

	/* This is gonna hurt... */
	for (; nasty_tricks_count > 0; nasty_tricks_count--) {
		/* ...but a high saving throw does help a little. */
		if (2 * context->obj->pval < player->state.skills[SKILL_SAVE]) {
			if (one_in_(6)) {
				take_hit(player, damroll(5, 20), "a chest dispel-player trap");
			} else if (one_in_(5)) {
				player_inc_timed(player, TMD_CUT, 200, true, true, true);
			} else if (one_in_(4)) {
				if (!player_of_has(player, OF_FREE_ACT)) {
					player_inc_timed(player, TMD_PARALYZED, 2 + randint0(6),
									 true, true, true);
				} else {
					player_inc_timed(player, TMD_STUN, 10 + randint0(100),
									 true, true, true);
				}
			} else if (one_in_(3)) {
				effect_simple(EF_DISENCHANT, context->origin, "0", 0, 0, 0, 0, 0, NULL);
			} else if (one_in_(2)) {
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_STR, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_INT, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_WIS, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_DEX, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_CON, 0, 0, 0, 0, NULL);
			} else {
				effect_simple(EF_CLOUD, context->origin, "150", PROJ_NETHER, 1, 0, 0, 0, NULL);
			}
		}
	}

	return false;
}